

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini_bus.hpp
# Opt level: O2

void __thiscall
mini_bus::
NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::failed(NotifyToken<std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *this,exception_ptr *ptr)

{
  std::mutex::lock(&this->mtx);
  std::__exception_ptr::exception_ptr::operator=(&this->ex,ptr);
  pthread_mutex_unlock((pthread_mutex_t *)&this->mtx);
  std::condition_variable::notify_one();
  return;
}

Assistant:

inline void failed(std::exception_ptr ptr) override {
    {
      std::lock_guard lock{mtx};
      ex = ptr;
    }
    cv.notify_one();
  }